

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_x86.h
# Opt level: O1

void aom_dc_left_predictor_8x32_sse2(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  uint uVar1;
  uint6 uVar2;
  ulong uVar3;
  undefined1 auVar4 [11];
  undefined1 auVar5 [13];
  int iVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ushort uVar9;
  ushort uVar15;
  ushort uVar17;
  ushort uVar18;
  undefined1 auVar10 [16];
  ushort uVar19;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 uVar14;
  byte bVar16;
  
  auVar10 = psadbw(*(undefined1 (*) [16])left,(undefined1  [16])0x0);
  auVar7 = psadbw((undefined1  [16])0x0,*(undefined1 (*) [16])(left + 0x10));
  auVar8._0_2_ = auVar7._0_2_ + auVar10._0_2_;
  auVar8._2_2_ = auVar7._2_2_ + auVar10._2_2_;
  auVar8._4_2_ = auVar7._4_2_ + auVar10._4_2_;
  auVar8._6_2_ = auVar7._6_2_ + auVar10._6_2_;
  auVar8._8_2_ = auVar7._8_2_ + auVar10._8_2_;
  auVar8._10_2_ = auVar7._10_2_ + auVar10._10_2_;
  auVar8._12_2_ = auVar7._12_2_ + auVar10._12_2_;
  auVar8._14_2_ = auVar7._14_2_ + auVar10._14_2_;
  uVar9 = auVar8._8_2_ + auVar8._0_2_ + 0x10;
  uVar15 = auVar8._10_2_ + auVar8._2_2_ + 0x10;
  uVar17 = auVar8._12_2_ + auVar8._4_2_ + 0x10;
  uVar18 = auVar8._14_2_ + auVar8._6_2_ + 0x10;
  auVar10._0_2_ = uVar9 >> 5;
  uVar19 = uVar18 >> 5;
  uVar1 = CONCAT22((ushort)(auVar8._8_2_ * 2 + 0x10U) >> 5,uVar19);
  auVar11._0_9_ = (unkuint9)uVar1 << 0x30;
  uVar2 = CONCAT24((ushort)(auVar8._10_2_ * 2 + 0x10U) >> 5,uVar1);
  auVar4._6_5_ = 0;
  auVar4._0_6_ = uVar2;
  auVar12._0_11_ = auVar4 << 0x30;
  uVar3 = CONCAT26((ushort)(auVar8._12_2_ * 2 + 0x10U) >> 5,uVar2);
  auVar5._8_5_ = 0;
  auVar5._0_8_ = uVar3;
  auVar13._0_13_ = auVar5 << 0x30;
  bVar16 = (byte)(uVar18 >> 8);
  auVar13._14_2_ = (undefined2)(CONCAT19(bVar16 >> 5,CONCAT18(bVar16 >> 5,uVar3)) >> 0x40);
  auVar13[0xd] = (char)uVar19;
  bVar16 = (byte)(uVar17 >> 0xd);
  auVar12._12_4_ = (undefined4)(CONCAT37(auVar13._13_3_,CONCAT16((char)uVar19,uVar2)) >> 0x30);
  auVar12[0xb] = bVar16;
  uVar14 = (undefined1)(uVar17 >> 5);
  auVar11._10_6_ = (undefined6)(CONCAT55(auVar12._11_5_,CONCAT14(bVar16,uVar1)) >> 0x20);
  auVar11[9] = uVar14;
  bVar16 = (byte)(uVar15 >> 0xd);
  auVar10._8_8_ = (undefined8)(CONCAT73(auVar11._9_7_,CONCAT12(uVar14,uVar19)) >> 0x10);
  auVar10[7] = bVar16;
  auVar10[6] = bVar16;
  uVar14 = (undefined1)(uVar15 >> 5);
  auVar10[5] = uVar14;
  auVar10[4] = uVar14;
  bVar16 = (byte)(uVar9 >> 8);
  auVar10[3] = bVar16 >> 5;
  auVar10[2] = bVar16 >> 5;
  auVar7[0] = (undefined1)auVar10._0_2_;
  auVar7._2_14_ = auVar10._2_14_;
  auVar7[1] = auVar7[0];
  auVar7 = pshuflw(auVar8,auVar7,0);
  iVar6 = 0x20;
  do {
    *(long *)dst = auVar7._0_8_;
    dst = dst + stride;
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  return;
}

Assistant:

static inline __m128i dc_sum_32_sse2(const uint8_t *ref) {
  __m128i x0 = _mm_load_si128((__m128i const *)ref);
  __m128i x1 = _mm_load_si128((__m128i const *)(ref + 16));
  const __m128i zero = _mm_setzero_si128();
  x0 = _mm_sad_epu8(x0, zero);
  x1 = _mm_sad_epu8(x1, zero);
  x0 = _mm_add_epi16(x0, x1);
  const __m128i high = _mm_unpackhi_epi64(x0, x0);
  return _mm_add_epi16(x0, high);
}